

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Menu_add.cxx
# Opt level: O2

int __thiscall Fl_Menu_::add(Fl_Menu_ *this,char *str)

{
  char cVar1;
  uint shortcut;
  int iVar2;
  long lVar3;
  char buf [1024];
  char local_428 [1032];
  
  iVar2 = 0;
  do {
    if (*str == '\0') {
      return iVar2;
    }
    shortcut = 0;
    for (lVar3 = 0; lVar3 != 0x3fe; lVar3 = lVar3 + 1) {
      cVar1 = *str;
      if (cVar1 == '\t') {
        local_428[lVar3] = '\0';
        shortcut = fl_old_shortcut(str);
      }
      else {
        if ((cVar1 == '\0') || (cVar1 == '|')) break;
        local_428[lVar3] = cVar1;
      }
      str = str + 1;
    }
    local_428[lVar3] = '\0';
    iVar2 = add(this,local_428,shortcut,(Fl_Callback *)0x0,(void *)0x0,0);
    str = str + (*str != '\0');
  } while( true );
}

Assistant:

int Fl_Menu_::add(const char *str) {
  char buf[1024];
  int r = 0;
  while (*str) {
    int sc = 0;
    char *c;
    for (c = buf; c < (buf + sizeof(buf) - 2) && *str && *str != '|'; str++) {
      if (*str == '\t') {*c++ = 0; sc = fl_old_shortcut(str);}
      else *c++ = *str;
    }
    *c = 0;
    r = add(buf, sc, 0, 0, 0);
    if (*str) str++;
  }
  return r;
}